

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.h
# Opt level: O0

void pbrt::detail::
     stringPrintfRecursive<float&,float&,float&,std::__cxx11::string,float&,float&,float&,std::__cxx11::string,float&,float&,float&>
               (string *s,char *fmt,float *v,float *args,float *args_1,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_2,
               float *args_3,float *args_4,float *args_5,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_6,
               float *args_7,float *args_8,float *args_9)

{
  bool bVar1;
  long lVar2;
  char **v_00;
  ulong uVar3;
  char *in_RCX;
  string *in_RDX;
  string *in_RDI;
  float *in_R8;
  float *in_R9;
  float *unaff_R14;
  float *unaff_R15;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *unaff_retaddr;
  float *in_stack_00000008;
  float *in_stack_00000010;
  float *in_stack_00000018;
  stringstream ss;
  bool isDFmt;
  bool isSFmt;
  bool precisionViaArg;
  string nextFmt;
  char *in_stack_fffffffffffffd28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd30;
  string *in_stack_fffffffffffffd50;
  char **in_stack_fffffffffffffd58;
  float *in_stack_fffffffffffffd60;
  char *in_stack_fffffffffffffd68;
  string local_278 [32];
  undefined8 local_258;
  string local_250 [24];
  char *in_stack_fffffffffffffdc8;
  stringstream local_230 [4];
  int in_stack_fffffffffffffdd4;
  char *in_stack_fffffffffffffdd8;
  undefined1 local_220 [4];
  LogLevel in_stack_fffffffffffffde4;
  float in_stack_fffffffffffffe2c;
  string local_a8 [53];
  byte local_73;
  byte local_72;
  byte local_71;
  string local_70 [16];
  float *in_stack_ffffffffffffffa0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffa8;
  
  copyToFormatString(in_stack_fffffffffffffd58,in_stack_fffffffffffffd50);
  lVar2 = std::__cxx11::string::find((char)local_70,0x2a);
  local_71 = lVar2 != -1;
  lVar2 = std::__cxx11::string::find((char)local_70,0x73);
  local_72 = lVar2 != -1;
  lVar2 = std::__cxx11::string::find((char)local_70,100);
  local_73 = lVar2 != -1;
  if ((local_71 & 1) != 0) {
    LogFatal(in_stack_fffffffffffffde4,in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd4,
             in_stack_fffffffffffffdc8);
  }
  bVar1 = std::operator==(in_stack_fffffffffffffd30,in_stack_fffffffffffffd28);
  if ((bVar1) ||
     (bVar1 = std::operator==(in_stack_fffffffffffffd30,in_stack_fffffffffffffd28), bVar1)) {
    FloatToString_abi_cxx11_(in_stack_fffffffffffffe2c);
    std::__cxx11::string::operator+=(in_RDI,local_a8);
    std::__cxx11::string::~string(local_a8);
  }
  else {
    if ((local_73 & 1) != 0) {
      LogFatal(in_stack_fffffffffffffde4,in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd4,
               in_stack_fffffffffffffdc8);
    }
    if ((local_72 & 1) == 0) {
      uVar3 = std::__cxx11::string::empty();
      if ((uVar3 & 1) != 0) {
        LogFatal(in_stack_fffffffffffffde4,in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd4,
                 in_stack_fffffffffffffdc8);
      }
      std::__cxx11::string::c_str();
      formatOne<float&>(in_stack_fffffffffffffd68,in_stack_fffffffffffffd60);
      std::__cxx11::string::operator+=(in_RDI,(string *)&stack0xfffffffffffffd68);
      std::__cxx11::string::~string((string *)&stack0xfffffffffffffd68);
    }
    else {
      std::__cxx11::stringstream::stringstream(local_230);
      std::ostream::operator<<(local_220,*(float *)in_RDX);
      v_00 = (char **)std::__cxx11::string::c_str();
      std::__cxx11::stringstream::str();
      local_258 = std::__cxx11::string::c_str();
      formatOne<char_const*>(in_stack_fffffffffffffd68,v_00);
      std::__cxx11::string::operator+=(in_RDI,local_250);
      std::__cxx11::string::~string(local_250);
      std::__cxx11::string::~string(local_278);
      std::__cxx11::stringstream::~stringstream(local_230);
    }
  }
  stringPrintfRecursive<float&,float&,std::__cxx11::string,float&,float&,float&,std::__cxx11::string,float&,float&,float&>
            (in_RDX,in_RCX,in_R8,in_R9,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,unaff_R14
             ,unaff_R15,unaff_retaddr,in_stack_00000008,in_stack_00000010,in_stack_00000018);
  std::__cxx11::string::~string(local_70);
  return;
}

Assistant:

inline void stringPrintfRecursive(std::string *s, const char *fmt, T &&v,
                                  Args &&... args) {
    std::string nextFmt = copyToFormatString(&fmt, s);
    bool precisionViaArg = nextFmt.find('*') != std::string::npos;

    bool isSFmt = nextFmt.find('s') != std::string::npos;
    bool isDFmt = nextFmt.find('d') != std::string::npos;

    if constexpr (std::is_integral<std::decay_t<T>>::value) {
        if (precisionViaArg) {
            stringPrintfRecursiveWithPrecision(s, fmt, nextFmt, v,
                                               std::forward<Args>(args)...);
            return;
        }
    } else if (precisionViaArg)
        LOG_FATAL("Non-integral type provided for %* format.");

    if constexpr (std::is_same<std::decay_t<T>, float>::value)
        if (nextFmt == "%f" || nextFmt == "%s") {
            *s += detail::FloatToString(v);
            goto done;
        }

    if constexpr (std::is_same<std::decay_t<T>, double>::value)
        if (nextFmt == "%f" || nextFmt == "%s") {
            *s += detail::DoubleToString(v);
            goto done;
        }

    if constexpr (std::is_same<std::decay_t<T>, bool>::value)  // FIXME: %-10s with bool
        if (isSFmt) {
            *s += bool(v) ? "true" : "false";
            goto done;
        }

    if constexpr (std::is_integral<std::decay_t<T>>::value) {
        if (isDFmt) {
            nextFmt.replace(nextFmt.find('d'), 1,
                            detail::IntegerFormatTrait<std::decay_t<T>>::fmt());
            *s += formatOne(nextFmt.c_str(), std::forward<T>(v));
            goto done;
        }
    } else if (isDFmt)
        LOG_FATAL("Non-integral type passed to %d format.");

    if (isSFmt) {
        std::stringstream ss;
        ss << v;
        *s += formatOne(nextFmt.c_str(), ss.str().c_str());
    } else if (!nextFmt.empty())
        *s += formatOne(nextFmt.c_str(), std::forward<T>(v));
    else
        LOG_FATAL("Excess values passed to Printf.");

done:
    stringPrintfRecursive(s, fmt, std::forward<Args>(args)...);
}